

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O2

void deqp::gls::anon_unknown_1::render
               (TestLog *log,RenderContext *renderContext,RenderBits renderBits,Random *rng,
               ShaderProgram *program,TextureBuffer *texture,PixelBufferAccess *target)

{
  ObjectTraits **this;
  RenderContext *pRVar1;
  deUint32 seed;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  TextureBuffer *pTVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  Renderer renderer;
  int maxTextureBufferSize;
  TextureBuffer *local_580;
  RenderContext *local_578;
  ScopedLogSection renderSection;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coords_1;
  vector<const_char_*,_std::allocator<const_char_*>_> usedAs;
  pointer local_518;
  VertexAttrib vertexAttribs [1];
  Program program_1;
  anon_struct_16_2_44180aad bitInfos [4];
  Random rng_2;
  Random rng_1;
  pointer local_400;
  ConstPixelBufferAccess local_3e8;
  CoordFragmentShader coordFragmmentShader;
  PrimitiveList primitives;
  ConstPixelBufferAccess effectiveAccess;
  deRandom local_338;
  ostringstream stream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [22];
  VertexArray vao;
  
  local_578 = renderContext;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vao,"Render Texture buffer",(allocator<char> *)bitInfos);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stream,"Render Texture Buffer",(allocator<char> *)&rng_1);
  tcu::ScopedLogSection::ScopedLogSection(&renderSection,log,(string *)&vao,(string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  std::__cxx11::string::~string((string *)&vao);
  seed = deRandom_getUint32(&rng->m_rnd);
  pRVar1 = local_578;
  maxTextureBufferSize = 0;
  iVar2 = (*local_578->_vptr_RenderContext[3])(local_578);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8c2b,&maxTextureBufferSize);
  iVar2 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  dVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(dVar3,"query GL_MAX_TEXTURE_BUFFER_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x303);
  bitInfos[3].bit = RENDERBITS_AS_FRAGMENT_TEXTURE;
  bitInfos[3]._4_4_ = 0;
  bitInfos[3].str = "fragment texture";
  bitInfos[2].bit = RENDERBITS_AS_VERTEX_TEXTURE;
  bitInfos[2]._4_4_ = 0;
  bitInfos[2].str = "vertex texture";
  bitInfos[1].bit = RENDERBITS_AS_INDEX_ARRAY;
  bitInfos[1]._4_4_ = 0;
  bitInfos[1].str = "index array";
  bitInfos[0].bit = RENDERBITS_AS_VERTEX_ARRAY;
  bitInfos[0]._4_4_ = 0;
  bitInfos[0].str = "vertex array";
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 0x10) {
    if ((*(RenderBits *)((long)&bitInfos[0].bit + lVar9) & renderBits) != RENDERBITS_NONE) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&usedAs,(value_type *)((long)&bitInfos[0].str + lVar9));
    }
  }
  local_580 = texture;
  std::operator<<((ostream *)&stream,"Render using texture buffer as ");
  uVar8 = 0;
  while( true ) {
    uVar5 = (ulong)((long)usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    iVar2 = (int)uVar5;
    if ((long)iVar2 <= (long)uVar8) break;
    pcVar7 = " and ";
    if ((uVar8 + 1 == (uVar5 & 0xffffffff) && 1 < iVar2) || (pcVar7 = ", ", uVar8 != 0)) {
      std::operator<<((ostream *)&stream,pcVar7);
    }
    std::operator<<((ostream *)&stream,
                    usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8]);
    uVar8 = uVar8 + 1;
  }
  std::operator<<((ostream *)&stream,".");
  this = &vao.super_ObjectWrapper.m_traits;
  vao.super_ObjectWrapper.m_gl = (Functions *)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  pTVar6 = local_580;
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this,(string *)&rng_1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&vao,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&rng_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  pRVar1 = local_578;
  iVar2 = (*local_578->_vptr_RenderContext[3])(local_578);
  lVar9 = CONCAT44(extraout_var_01,iVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper(&vao,pRVar1);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&stream,pRVar1);
  (**(code **)(lVar9 + 0x1680))((program->m_program).m_program);
  (**(code **)(lVar9 + 0xd8))(vao.super_ObjectWrapper.m_object);
  (**(code **)(lVar9 + 0x610))(0);
  if ((renderBits & RENDERBITS_AS_VERTEX_ARRAY) == RENDERBITS_NONE) {
    deRandom_init(&rng_1.m_rnd,seed);
    bitInfos[1].bit = RENDERBITS_NONE;
    bitInfos[1]._4_4_ = 0;
    bitInfos[0].bit = RENDERBITS_NONE;
    bitInfos[0]._4_4_ = 0;
    bitInfos[0].str = (char *)0x0;
    usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)rng_1.m_rnd._0_8_;
    usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)rng_1.m_rnd._8_8_;
    genRandomCoords((Random *)&usedAs,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)bitInfos,0,0x200);
    (**(code **)(lVar9 + 0x40))(0x8892,(undefined4)local_318[0]._M_allocated_capacity);
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)(int)((int)bitInfos[0].str - (RenderBits)bitInfos[0]._0_8_),
               bitInfos[0]._0_8_,0x88e0);
    (**(code **)(lVar9 + 0x19f0))(0,2,0x1401,1,0,0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)bitInfos);
  }
  else {
    (**(code **)(lVar9 + 0x40))(0x8892,pTVar6->m_glBuffer);
    (**(code **)(lVar9 + 0x19f0))(0,2,0x1401,1,0,0);
  }
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    uVar4 = (**(code **)(lVar9 + 0xb48))((program->m_program).m_program,"u_vtxSampler");
    (**(code **)(lVar9 + 8))(0x84c0);
    (**(code **)(lVar9 + 0xb8))(0x8c2a,pTVar6->m_glTexture);
    (**(code **)(lVar9 + 0x14f0))(uVar4,0);
  }
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    uVar4 = (**(code **)(lVar9 + 0xb48))((program->m_program).m_program,"u_fragSampler");
    (**(code **)(lVar9 + 8))(0x84c1);
    (**(code **)(lVar9 + 0xb8))(0x8c2a,pTVar6->m_glTexture);
    (**(code **)(lVar9 + 0x14f0))(uVar4,1);
    (**(code **)(lVar9 + 8))(0x84c0);
  }
  if ((renderBits & RENDERBITS_AS_INDEX_ARRAY) == RENDERBITS_NONE) {
    (**(code **)(lVar9 + 0x538))(4,0,0x18);
  }
  else {
    (**(code **)(lVar9 + 0x40))(0x8893,pTVar6->m_glBuffer);
    (**(code **)(lVar9 + 0x568))(4,0x18,0x1401,0);
    (**(code **)(lVar9 + 0x40))(0x8893,0);
  }
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    (**(code **)(lVar9 + 8))(0x84c1);
    (**(code **)(lVar9 + 0xb8))(0x8c2a,0);
  }
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    (**(code **)(lVar9 + 8))(0x84c0);
    (**(code **)(lVar9 + 0xb8))(0x8c2a,0);
  }
  (**(code **)(lVar9 + 0x40))(0x8892,0);
  (**(code **)(lVar9 + 0x518))(0);
  (**(code **)(lVar9 + 0xd8))(0);
  (**(code **)(lVar9 + 0x1680))(0);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"Rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x28d);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&stream);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  glu::getTextureBufferEffectiveRefTexture(&effectiveAccess,pTVar6,maxTextureBufferSize);
  rr::VertexShader::VertexShader((VertexShader *)&usedAs,1,1);
  usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR_shadeVertices_00a305a0;
  *(undefined4 *)
   usedAs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
   super__Vector_impl_data._M_finish = 0;
  local_518->type = GENERICVECTYPE_FLOAT;
  rr::VertexShader::VertexShader((VertexShader *)bitInfos,1,1);
  bitInfos[0]._0_8_ = &PTR_shadeVertices_00a305d0;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&bitInfos[3].str,&effectiveAccess);
  bitInfos[0].str[0] = '\0';
  bitInfos[0].str[1] = '\0';
  bitInfos[0].str[2] = '\0';
  bitInfos[0].str[3] = '\0';
  *(undefined4 *)bitInfos[2]._0_8_ = 0;
  rr::FragmentShader::FragmentShader(&coordFragmmentShader.super_FragmentShader,1,1);
  coordFragmmentShader.super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&PTR_shadeFragments_00a30600;
  (coordFragmmentShader.super_FragmentShader.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (coordFragmmentShader.super_FragmentShader.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader((FragmentShader *)&rng_1,1,1);
  rng_1.m_rnd._0_8_ = &PTR_shadeFragments_00a30630;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_3e8,&effectiveAccess);
  *(undefined4 *)rng_1.m_rnd._8_8_ = 0;
  local_400->type = GENERICVECTYPE_FLOAT;
  rr::Renderer::Renderer(&renderer);
  vao.super_ObjectWrapper.m_gl = (Functions *)0x0;
  vao.super_ObjectWrapper.m_traits._0_4_ = (target->super_ConstPixelBufferAccess).m_size.m_data[0];
  vao.super_ObjectWrapper.m_traits._4_4_ = (target->super_ConstPixelBufferAccess).m_size.m_data[1];
  vao.super_ObjectWrapper.m_object = 0;
  vao.super_ObjectWrapper._20_4_ = 0x3f800000;
  rr::RenderState::RenderState
            ((RenderState *)&stream,(ViewportState *)&vao,VIEWPORTORIENTATION_LOWER_LEFT);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&rng_2,target);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)vertexAttribs);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&primitives);
  rr::RenderTarget::RenderTarget
            ((RenderTarget *)&vao,(MultisamplePixelBufferAccess *)&rng_2,
             (MultisamplePixelBufferAccess *)vertexAttribs,
             (MultisamplePixelBufferAccess *)&primitives);
  vertexAttribs[0].generic.v._8_8_ = 0;
  coords_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertexAttribs[0].pointer = (void *)0x0;
  vertexAttribs[0].generic.v._0_8_ = 0;
  vertexAttribs[0].type = VERTEXATTRIBTYPE_FLOAT;
  vertexAttribs[0].size = 0;
  vertexAttribs[0].stride = 0;
  vertexAttribs[0].instanceDivisor = 0;
  coords_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coords_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((renderBits & RENDERBITS_AS_VERTEX_ARRAY) == RENDERBITS_NONE) {
    deRandom_init(&rng_2.m_rnd,seed);
    pTVar6 = local_580;
    local_338.x = rng_2.m_rnd.x;
    local_338.y = rng_2.m_rnd.y;
    local_338.z = rng_2.m_rnd.z;
    local_338.w = rng_2.m_rnd.w;
    genRandomCoords((Random *)&local_338,&coords_1,0,0x200);
    vertexAttribs[0].pointer =
         coords_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  else {
    vertexAttribs[0].pointer = (local_580->m_refBuffer).m_ptr;
    pTVar6 = local_580;
  }
  vertexAttribs[0].type = VERTEXATTRIBTYPE_NONPURE_UNORM8;
  vertexAttribs[0].size = 2;
  rng_2.m_rnd._0_8_ = (RenderState *)&stream;
  rng_2.m_rnd._8_8_ = (RenderTarget *)&vao;
  if ((renderBits & RENDERBITS_AS_INDEX_ARRAY) == RENDERBITS_NONE) {
    rr::PrimitiveList::PrimitiveList(&primitives,PRIMITIVETYPE_TRIANGLES,0x18,0);
    rr::Renderer::draw(&renderer,(DrawCommand *)&rng_2);
  }
  else {
    rr::DrawIndices::DrawIndices
              ((DrawIndices *)&rng_2,(pTVar6->m_refBuffer).m_ptr,INDEXTYPE_UINT8,0);
    rr::PrimitiveList::PrimitiveList(&primitives,PRIMITIVETYPE_TRIANGLES,0x18,(DrawIndices *)&rng_2)
    ;
    rr::Renderer::draw(&renderer,(DrawCommand *)&rng_2);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&coords_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  rr::Renderer::~Renderer(&renderer);
  rr::FragmentShader::~FragmentShader((FragmentShader *)&rng_1);
  rr::FragmentShader::~FragmentShader(&coordFragmmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader((VertexShader *)bitInfos);
  rr::VertexShader::~VertexShader((VertexShader *)&usedAs);
  tcu::ScopedLogSection::~ScopedLogSection(&renderSection);
  return;
}

Assistant:

void render (TestLog&						log,
			 glu::RenderContext&			renderContext,
			 RenderBits						renderBits,
			 de::Random&					rng,
			 glu::ShaderProgram&			program,
			 glu::TextureBuffer&			texture,
			 const tcu::PixelBufferAccess&	target)
{
	const tcu::ScopedLogSection	renderSection			(log, "Render Texture buffer", "Render Texture Buffer");
	const int					triangleCount			= 8;
	const deUint32				coordSeed				= rng.getUint32();
	int							maxTextureBufferSize	= 0;

	renderContext.getFunctions().getIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE, &maxTextureBufferSize);
	GLU_EXPECT_NO_ERROR(renderContext.getFunctions().getError(), "query GL_MAX_TEXTURE_BUFFER_SIZE");
	DE_ASSERT(maxTextureBufferSize > 0); // checked in init()

	logRendering(log, renderBits);

	renderGL(renderContext, renderBits, coordSeed, triangleCount, program, texture);
	renderReference(renderBits, coordSeed, triangleCount, texture, maxTextureBufferSize, target);
}